

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu540c.c
# Opt level: O2

MPP_RET hal_h264e_vepu540c_ret_task(void *hal,HalEncTask *task)

{
  EncRcTask *pEVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  bool bVar6;
  
  pEVar1 = task->rc_task;
  lVar2 = *(long *)((long)hal + 0x160);
  uVar4 = *(int *)(*(long *)((long)hal + 0x38) + 0x40) *
          *(int *)(*(long *)((long)hal + 0x38) + 0x3c);
  bVar6 = true;
  if (((byte)hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu540c","enter %p\n","hal_h264e_vepu540c_ret_task",hal);
    bVar6 = ((byte)hal_h264e_debug & 2) == 0;
  }
  task->length = task->length + task->hw_length;
  iVar5 = task->hw_length << 3;
  (pEVar1->info).bit_real = iVar5;
  uVar3 = *(uint *)(lVar2 + 0x1384) / uVar4;
  (pEVar1->info).quality_real = uVar3;
  uVar4 = (((*(uint *)(lVar2 + 0x140c) & 0x1fffff) +
           (*(uint *)(lVar2 + 0x1410) & 0x7fffff) + (*(uint *)(lVar2 + 0x1414) & 0x7fffff)) * 0x100)
          / uVar4;
  (pEVar1->info).iblk4_prop = uVar4;
  (pEVar1->info).sse = (ulong)*(uint6 *)(lVar2 + 0x137e);
  (pEVar1->info).lvl16_inter_num = *(uint *)(lVar2 + 0x1400) & 0x1fffff;
  (pEVar1->info).lvl8_inter_num = *(uint *)(lVar2 + 0x1404) & 0x7fffff;
  (pEVar1->info).lvl16_intra_num = *(uint *)(lVar2 + 0x140c) & 0x1fffff;
  (pEVar1->info).lvl8_intra_num = *(uint *)(lVar2 + 0x1410) & 0x7fffff;
  (pEVar1->info).lvl4_intra_num = *(uint *)(lVar2 + 0x1414) & 0x7fffff;
  *(int *)((long)hal + 0xf0) = iVar5;
  *(uint *)((long)hal + 0xf4) = uVar3;
  *(uint *)((long)hal + 0x100) = uVar4;
  (task->hal_ret).data = (void *)((long)hal + 0xd0);
  (task->hal_ret).number = 1;
  if (!bVar6) {
    _mpp_log_l(4,"hal_h264e_vepu540c","leave %p\n","hal_h264e_vepu540c_ret_task",hal);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET hal_h264e_vepu540c_ret_task(void *hal, HalEncTask *task)
{
    HalH264eVepu540cCtx *ctx = (HalH264eVepu540cCtx *)hal;
    EncRcTaskInfo *rc_info = &task->rc_task->info;
    RK_U32 mb_w = ctx->sps->pic_width_in_mbs;
    RK_U32 mb_h = ctx->sps->pic_height_in_mbs;
    RK_U32 mbs = mb_w * mb_h;
    HalVepu540cRegSet *regs_set = (HalVepu540cRegSet *)ctx->regs_set;
    hal_h264e_dbg_func("enter %p\n", hal);

    // update total hardware length
    task->length += task->hw_length;

    // setup bit length for rate control
    rc_info->bit_real = task->hw_length * 8;
    rc_info->quality_real = regs_set->reg_st.qp_sum / mbs;
    /*
        rc_info->madi = (!regs_set->reg_st.st_bnum_b16.num_b16) ? 0 :
                        regs_set->reg_st.madi /  regs_set->reg_st.st_bnum_b16.num_b16;
        rc_info->madp = (!regs_set->reg_st.st_bnum_cme.num_ctu) ? 0 :
                        regs_set->reg_st.madi / regs_set->reg_st.st_bnum_cme.num_ctu;*/

    rc_info->iblk4_prop = (regs_set->reg_st.st_pnum_i4.pnum_i4 +
                           regs_set->reg_st.st_pnum_i8.pnum_i8 +
                           regs_set->reg_st.st_pnum_i16.pnum_i16) * 256 / mbs;

    rc_info->sse = ((RK_S64)regs_set->reg_st.sse_h32 << 16) +
                   (regs_set->reg_st.st_sse_bsl.sse_l16 & 0xffff);
    rc_info->lvl16_inter_num = regs_set->reg_st.st_pnum_p16.pnum_p16;
    rc_info->lvl8_inter_num  = regs_set->reg_st.st_pnum_p8.pnum_p8;
    rc_info->lvl16_intra_num = regs_set->reg_st.st_pnum_i16.pnum_i16;
    rc_info->lvl8_intra_num  = regs_set->reg_st.st_pnum_i8.pnum_i8;
    rc_info->lvl4_intra_num  = regs_set->reg_st.st_pnum_i4.pnum_i4;

    ctx->hal_rc_cfg.bit_real = rc_info->bit_real;
    ctx->hal_rc_cfg.quality_real = rc_info->quality_real;
    ctx->hal_rc_cfg.iblk4_prop = rc_info->iblk4_prop;

    task->hal_ret.data   = &ctx->hal_rc_cfg;
    task->hal_ret.number = 1;

    hal_h264e_dbg_func("leave %p\n", hal);

    return MPP_OK;
}